

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O3

void __thiscall
BBDT<TTA>::PerformLabelingMem
          (BBDT<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer piVar10;
  BBDT<TTA> *pBVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  uint uVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  double dVar33;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_340 [104];
  Mat local_2d8 [16];
  long local_2c8;
  long *local_290;
  long local_278;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  long *local_258;
  BBDT<TTA> *local_250;
  long local_248;
  long local_240;
  long local_238;
  long *local_230;
  long *local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_220;
  long *local_218;
  long local_210;
  long *local_208;
  long local_200;
  pointer local_1f8;
  pointer local_1f0;
  long local_1e8;
  long local_1e0;
  undefined1 local_1d8 [104];
  Mat local_170 [16];
  long local_160;
  long *local_128;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar13 = *(uint *)&pMVar6->field_0x8;
  uVar28 = (ulong)uVar13;
  iVar5 = *(int *)&pMVar6->field_0xc;
  lVar27 = (long)iVar5;
  TTA::MemAlloc(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) *
                ((int)((uVar13 - ((int)(uVar13 + 1) >> 0x1f)) + 1) >> 1) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1d8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_340,&local_110,0);
  local_250 = this;
  local_220 = accesses;
  if ((int)uVar13 < 1) {
    uVar13 = TTA::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  }
  else {
    uVar31 = 0;
    local_278 = lVar27;
    local_270 = uVar28;
    do {
      if (0 < (int)lVar27) {
        lVar30 = uVar31 - 1;
        lVar20 = uVar31 - 2;
        uVar19 = uVar31 | 1;
        uVar29 = 0;
        do {
          lVar14 = *local_128;
          lVar22 = lVar14 * uVar31 + local_160;
          piVar1 = (int *)(lVar22 + uVar29 * 4);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)local_1d8._80_8_;
          lVar21 = lVar18 * uVar31 + local_1d8._24_8_;
          if (*(char *)(uVar29 + lVar21) == '\0') {
            if (uVar19 < uVar28) {
              lVar24 = lVar14 * uVar19 + local_160;
              piVar1 = (int *)(lVar24 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar25 = lVar18 * uVar19 + local_1d8._24_8_;
              if (*(char *)(uVar29 + lVar25) == '\0') goto LAB_0019d9df;
              uVar23 = uVar29 | 1;
              if ((lVar27 <= (long)uVar23) ||
                 (piVar1 = (int *)(lVar22 + uVar23 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar21 + uVar23) == '\0')) {
                if (uVar29 != 0) {
                  lVar14 = *local_128;
                  piVar1 = (int *)(lVar14 * uVar19 + local_160 + -4 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = *(long *)local_1d8._80_8_;
                  if ((*(char *)((uVar29 - 1) + lVar18 * uVar19 + local_1d8._24_8_) != '\0') ||
                     (piVar1 = (int *)(local_160 + lVar14 * uVar31 + -4 + uVar29 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)((uVar29 - 1) + local_1d8._24_8_ + lVar18 * uVar31) != '\0'))
                  goto LAB_0019e9f8;
                }
                goto LAB_0019e57c;
              }
              if (uVar29 != 0) {
                piVar1 = (int *)(lVar22 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -1 + uVar29) == '\0') {
                  piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar25 + -1 + uVar29) == '\0') goto LAB_0019e1ca;
                  if (uVar31 != 0) {
                    lVar24 = lVar14 * lVar30 + local_160;
                    piVar1 = (int *)(lVar24 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar25 = lVar18 * lVar30 + local_1d8._24_8_;
                    if (*(char *)(uVar23 + lVar25) != '\0') {
                      piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar21 + -2 + uVar29) == '\0') goto LAB_0019e7ad;
                      piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar25 + -1 + uVar29) == '\0') goto LAB_0019e5b2;
                      piVar1 = (int *)(lVar24 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar18 = *(long *)local_1d8._80_8_;
                      if (*(char *)(uVar29 + lVar18 * lVar30 + local_1d8._24_8_) == '\0') {
                        piVar1 = (int *)(*local_128 * lVar20 + local_160 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        goto LAB_0019db9b;
                      }
                      goto LAB_0019e9f8;
                    }
                    if (((long)(uVar29 + 2) < local_278) &&
                       (piVar1 = (int *)(lVar24 + 8 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                       *(char *)(lVar25 + 2 + uVar29) != '\0')) {
                      lVar17 = local_160 + lVar14 * lVar20;
                      piVar1 = (int *)(lVar17 + uVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = local_1d8._24_8_ + lVar18 * lVar20;
                      if (*(char *)(uVar23 + lVar14) == '\0') {
                        piVar1 = (int *)(lVar24 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar27 = local_278;
                        if (*(char *)(lVar25 + uVar29) == '\0') goto LAB_0019ebeb;
                        piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar21 + -2 + uVar29) != '\0') {
                          piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar25 + -1 + uVar29) != '\0') goto LAB_0019ebeb;
LAB_0019eb57:
                          piVar1 = (int *)(lVar24 + -8 + uVar29 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar25 + -2 + uVar29) != '\0') {
                            piVar1 = (int *)(lVar17 + -4 + uVar29 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar21 = *local_290;
                            cVar4 = *(char *)(lVar14 + -1 + uVar29);
                            goto joined_r0x0019e8ad;
                          }
                        }
                        lVar27 = *local_290 * lVar20 + local_2c8;
                        piVar1 = (int *)(lVar27 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar14 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                        uVar13 = *(uint *)(lVar14 + uVar29 * 4);
LAB_0019ecb7:
                        piVar1 = (int *)(lVar27 + 8 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar16 = *(uint *)(lVar14 + 8 + uVar29 * 4);
                        lVar27 = local_278;
                        goto LAB_0019ecc1;
                      }
                      piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar27 = local_278;
                      if (*(char *)(lVar21 + -2 + uVar29) == '\0') goto LAB_0019ebeb;
                      piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar25 + -1 + uVar29) == '\0') goto LAB_0019e9c7;
LAB_0019e9e9:
                      piVar1 = (int *)(lVar24 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar27 = local_278;
                      if (*(char *)(lVar25 + uVar29) == '\0') {
                        piVar1 = (int *)(lVar17 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        bVar32 = *(char *)(lVar14 + uVar29) == '\0';
                        goto LAB_0019eaf3;
                      }
                      goto LAB_0019e9f8;
                    }
                    piVar1 = (int *)(lVar24 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_278;
                    if (*(char *)(lVar25 + uVar29) == '\0') goto LAB_0019e9f8;
                    piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar21 + -2 + uVar29) == '\0') goto LAB_0019e7ad;
                    piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar25 + -1 + uVar29) != '\0') goto LAB_0019e9f8;
                    piVar1 = (int *)(lVar24 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar4 = *(char *)(lVar25 + -2 + uVar29);
joined_r0x0019e7a7:
                    if (cVar4 != '\0') {
                      piVar1 = (int *)(local_160 + lVar14 * lVar20 + -4 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar4 = *(char *)((uVar29 - 1) + local_1d8._24_8_ + lVar18 * lVar20);
                      goto LAB_0019e276;
                    }
                    goto LAB_0019e7ad;
                  }
                  goto LAB_0019e9f8;
                }
                if (uVar31 == 0) goto LAB_0019e9f8;
                lVar14 = *local_128;
                lVar21 = lVar14 * lVar30 + local_160;
                piVar1 = (int *)(lVar21 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_1d8._80_8_;
                lVar22 = lVar18 * lVar30 + local_1d8._24_8_;
                if (*(char *)(uVar23 + lVar22) != '\0') {
                  piVar1 = (int *)(lVar21 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar22 + uVar29) != '\0') goto LAB_0019e9f8;
                  lVar14 = local_160 + lVar14 * lVar20;
                  piVar1 = (int *)(lVar14 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = local_1d8._24_8_ + lVar18 * lVar20;
                  if (*(char *)(uVar29 + lVar18) != '\0') {
                    piVar1 = (int *)(lVar21 + -4 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar22 + -1 + uVar29) == '\0') {
                      piVar1 = (int *)(lVar21 + -8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar22 + -2 + uVar29) != '\0') {
                        piVar1 = (int *)(lVar14 + -4 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        bVar32 = *(char *)(lVar18 + -1 + uVar29) == '\0';
                        goto LAB_0019d8a1;
                      }
                      goto LAB_0019e7ad;
                    }
                    goto LAB_0019e9f8;
                  }
                  lVar18 = *local_290;
                  piVar1 = (int *)(lVar18 * lVar20 + local_2c8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = *(long *)local_340._80_8_;
                  goto LAB_0019e7e6;
                }
                if ((lVar27 <= (long)(uVar29 + 2)) ||
                   (piVar1 = (int *)(lVar21 + 8 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar22 + 2 + uVar29) == '\0')) goto LAB_0019e9f8;
                lVar14 = local_160 + lVar14 * lVar20;
                piVar1 = (int *)(lVar14 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = local_1d8._24_8_ + lVar18 * lVar20;
                if (*(char *)(uVar23 + lVar18) == '\0') goto LAB_0019e48d;
                piVar1 = (int *)(lVar21 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar22 + uVar29) != '\0') goto LAB_0019e9f8;
                piVar1 = (int *)(lVar14 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar18 + uVar29) == '\0') goto LAB_0019ebeb;
                piVar1 = (int *)(lVar21 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar22 + -1 + uVar29) != '\0') goto LAB_0019e9f8;
                piVar1 = (int *)(lVar21 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar22 + -2 + uVar29) == '\0') goto LAB_0019ebeb;
                piVar1 = (int *)(lVar14 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                bVar32 = *(char *)(lVar18 + -1 + uVar29) == '\0';
LAB_0019eaf3:
                lVar14 = *local_290;
                if (bVar32) {
                  piVar1 = (int *)(lVar14 * lVar20 + local_2c8 + 8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = *(long *)local_340._80_8_;
                  uVar13 = *(uint *)(lVar18 * lVar20 + local_340._24_8_ + 8 + uVar29 * 4);
                  goto LAB_0019e2b8;
                }
                goto LAB_0019ea0f;
              }
LAB_0019e1ca:
              if (uVar31 == 0) goto LAB_0019e57c;
              lVar21 = lVar14 * lVar30 + local_160;
              piVar1 = (int *)(lVar21 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar22 = lVar18 * lVar30 + local_1d8._24_8_;
              if (*(char *)(uVar23 + lVar22) != '\0') goto LAB_0019dd4e;
              if ((lVar27 <= (long)(uVar29 + 2)) ||
                 (piVar1 = (int *)(lVar21 + 8 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar22 + 2 + uVar29) == '\0')) {
                piVar1 = (int *)(lVar21 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                cVar4 = *(char *)(lVar22 + uVar29);
                goto joined_r0x0019e576;
              }
              piVar1 = (int *)(lVar21 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar22 + uVar29) == '\0') goto LAB_0019e312;
LAB_0019dcbc:
              piVar1 = (int *)(local_160 + lVar14 * lVar20 + (uVar29 | 1) * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *local_290;
              lVar21 = lVar14 * lVar20 + local_2c8;
              if (*(char *)((uVar29 | 1) + local_1d8._24_8_ + lVar18 * lVar20) == '\0') {
                piVar1 = (int *)(lVar21 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                uVar13 = *(uint *)(lVar14 + uVar29 * 4);
                piVar1 = (int *)(lVar21 + 8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_0019e6fc;
              }
              piVar1 = (int *)(lVar21 + 8 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)local_340._80_8_;
LAB_0019dd13:
              uVar13 = *(uint *)(lVar18 * lVar20 + local_340._24_8_ + 8 + uVar29 * 4);
              piVar1 = (int *)(local_2c8 + lVar14 * uVar31 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_0019dd99;
            }
LAB_0019d9df:
            uVar23 = uVar29 | 1;
            if ((long)uVar23 < lVar27) {
              lVar14 = *local_128;
              piVar1 = (int *)(lVar14 * uVar31 + local_160 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)local_1d8._80_8_;
              if (*(char *)(uVar23 + lVar18 * uVar31 + local_1d8._24_8_) == '\0') {
                if ((uVar28 <= uVar19) ||
                   (piVar1 = (int *)(local_160 + lVar14 * uVar19 + uVar23 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar23 + local_1d8._24_8_ + lVar18 * uVar19) == '\0'))
                goto LAB_0019def8;
              }
              else if (uVar31 != 0) {
                lVar21 = lVar14 * lVar30 + local_160;
                piVar1 = (int *)(lVar21 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = lVar18 * lVar30 + local_1d8._24_8_;
                if (*(char *)(uVar23 + lVar22) == '\0') {
                  if (((long)(uVar29 + 2) < lVar27) &&
                     (piVar1 = (int *)(lVar21 + 8 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar22 + 2 + uVar29) != '\0')) {
                    piVar1 = (int *)(lVar21 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar22 + uVar29) == '\0') goto LAB_0019e312;
                    piVar1 = (int *)(local_160 + lVar14 * lVar20 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = *local_290;
                    lVar21 = lVar14 * lVar20 + local_2c8;
                    if (*(char *)(uVar23 + local_1d8._24_8_ + lVar18 * lVar20) != '\0') {
                      piVar1 = (int *)(lVar21 + 8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar18 = *(long *)local_340._80_8_;
                      goto LAB_0019dd13;
                    }
                    piVar1 = (int *)(lVar21 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                    uVar13 = *(uint *)(lVar14 + uVar29 * 4);
                    piVar1 = (int *)(lVar21 + 8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
LAB_0019e6fc:
                    uVar16 = *(uint *)(lVar14 + 8 + uVar29 * 4);
                    goto LAB_0019ec45;
                  }
                  piVar1 = (int *)(lVar21 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar4 = *(char *)(lVar22 + uVar29);
joined_r0x0019e576:
                  if (cVar4 == '\0') goto LAB_0019e57c;
                }
LAB_0019dd4e:
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar20 + local_2c8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_0019dd7d;
              }
LAB_0019e57c:
              uVar13 = TTA::MemNewLabel();
              goto LAB_0019e581;
            }
LAB_0019def8:
            piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + uVar29 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
            uVar13 = 0;
          }
          else if (uVar29 == 0) {
LAB_0019dba5:
            uVar23 = uVar29 | 1;
            if (lVar27 <= (long)uVar23) {
LAB_0019dd28:
              if (uVar31 != 0) {
                lVar21 = local_160 + lVar14 * lVar30;
                piVar1 = (int *)(lVar21 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = local_1d8._24_8_ + lVar18 * lVar30;
                if (*(char *)(uVar29 + lVar14) == '\0') {
                  if (uVar29 != 0) goto LAB_0019df34;
                  goto LAB_0019e57c;
                }
                goto LAB_0019dd4e;
              }
              goto LAB_0019e57c;
            }
            if (uVar31 == 0) {
LAB_0019dc61:
              piVar1 = (int *)(lVar22 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + uVar23) == '\0') goto LAB_0019dd28;
              if ((long)(uVar29 + 2) < lVar27) {
                if (uVar31 == 0) goto LAB_0019e57c;
                lVar21 = local_160 + lVar14 * lVar30;
                piVar1 = (int *)(lVar21 + 8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar22 = local_1d8._24_8_ + lVar18 * lVar30;
                if (*(char *)(uVar29 + 2 + lVar22) == '\0') goto LAB_0019dfa3;
                piVar1 = (int *)(lVar21 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar22 + uVar29) != '\0') goto LAB_0019dcbc;
                if ((uVar29 != 0) &&
                   (piVar1 = (int *)(lVar21 + -4 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar22 + -1 + uVar29) != '\0')) {
                  lVar21 = local_160 + lVar14 * lVar20;
                  piVar1 = (int *)(lVar21 + uVar23 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = local_1d8._24_8_ + lVar18 * lVar20;
                  if (*(char *)(uVar23 + lVar14) == '\0') {
                    lVar18 = *local_290 * lVar20 + local_2c8;
                    piVar1 = (int *)(lVar18 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = *(long *)local_340._80_8_;
                  }
                  else {
                    piVar1 = (int *)(lVar21 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar14 + uVar29) != '\0') goto LAB_0019e312;
                    lVar18 = *local_290 * lVar20 + local_2c8;
                    piVar1 = (int *)(lVar18 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = *(long *)local_340._80_8_;
                  }
                  lVar14 = lVar14 * lVar20 + local_340._24_8_;
                  uVar13 = *(uint *)(lVar14 + -8 + uVar29 * 4);
                  piVar1 = (int *)(lVar18 + 8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar14 + 8 + uVar29 * 4);
                  goto LAB_0019ec45;
                }
LAB_0019e312:
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar20 + local_2c8 + 8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_340._80_8_;
                uVar13 = *(uint *)(lVar18 * lVar20 + local_340._24_8_ + 8 + uVar29 * 4);
              }
              else {
                if (uVar31 == 0) goto LAB_0019e57c;
LAB_0019dfa3:
                lVar21 = local_160 + lVar14 * lVar30;
                piVar1 = (int *)(lVar21 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = local_1d8._24_8_ + lVar18 * lVar30;
                if (*(char *)(uVar29 + lVar14) != '\0') goto LAB_0019dd4e;
                if (uVar31 == 0 || uVar29 == 0) goto LAB_0019e57c;
LAB_0019df34:
                piVar1 = (int *)(lVar21 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar14 + -1 + uVar29) == '\0') goto LAB_0019e57c;
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar20 + local_2c8 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_340._80_8_;
                uVar13 = *(uint *)(lVar18 * lVar20 + local_340._24_8_ + -8 + uVar29 * 4);
              }
            }
            else {
              lVar24 = lVar14 * lVar30 + local_160;
              piVar1 = (int *)(lVar24 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar25 = lVar18 * lVar30 + local_1d8._24_8_;
              if (*(char *)(uVar23 + lVar25) == '\0') goto LAB_0019dc61;
              piVar1 = (int *)(lVar24 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              if (((*(char *)(lVar25 + uVar29) != '\0') || (uVar29 == 0)) ||
                 (piVar1 = (int *)(lVar24 + -4 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar25 + -1 + uVar29) == '\0')) goto LAB_0019dd4e;
              piVar1 = (int *)(local_160 + lVar14 * lVar20 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar29 + local_1d8._24_8_ + lVar18 * lVar20) == '\0') {
                lVar14 = *local_290 * lVar20 + local_2c8;
                piVar1 = (int *)(lVar14 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                uVar13 = *(uint *)(lVar18 + -8 + uVar29 * 4);
                piVar1 = (int *)(lVar14 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(uint *)(lVar18 + uVar29 * 4);
                goto LAB_0019ec45;
              }
              lVar14 = *local_290;
              piVar1 = (int *)(lVar14 * lVar20 + local_2c8 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
LAB_0019dd7d:
              lVar18 = *(long *)local_340._80_8_;
              uVar13 = *(uint *)(lVar18 * lVar20 + local_340._24_8_ + uVar29 * 4);
            }
            piVar1 = (int *)(lVar14 * uVar31 + local_2c8 + uVar29 * 4);
            *piVar1 = *piVar1 + 1;
LAB_0019dd99:
            lVar14 = lVar18 * uVar31 + local_340._24_8_;
          }
          else {
            piVar1 = (int *)(lVar22 + -4 + uVar29 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + -1 + uVar29) == '\0') {
              if ((uVar28 <= uVar19) ||
                 (piVar1 = (int *)(lVar14 * uVar19 + local_160 + -4 + uVar29 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)((uVar29 - 1) + lVar18 * uVar19 + local_1d8._24_8_) == '\0'))
              goto LAB_0019dba5;
              uVar23 = uVar29 | 1;
              if (lVar27 <= (long)uVar23) {
LAB_0019e07a:
                if (uVar31 != 0) {
                  lVar24 = lVar14 * lVar30 + local_160;
                  piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar25 = lVar18 * lVar30 + local_1d8._24_8_;
                  if (*(char *)((uVar29 - 1) + lVar25) == '\0') {
                    piVar1 = (int *)(lVar24 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar25 + uVar29) != '\0') {
                      piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar21 + -2 + uVar29) != '\0') {
                        piVar1 = (int *)(lVar24 + -8 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        cVar4 = *(char *)(lVar25 + -2 + uVar29);
                        goto joined_r0x0019e7a7;
                      }
LAB_0019e7ad:
                      lVar18 = *local_290;
                      goto LAB_0019e7c7;
                    }
                    goto LAB_0019e9f8;
                  }
                  piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar4 = *(char *)(lVar21 + -2 + uVar29);
                  lVar14 = *local_290;
joined_r0x0019e0c6:
                  if (cVar4 == '\0') {
                    piVar1 = (int *)(lVar14 * lVar20 + local_2c8 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar18 = *(long *)local_340._80_8_;
                    uVar13 = *(uint *)(lVar18 * lVar20 + local_340._24_8_ + -8 + uVar29 * 4);
                    goto LAB_0019e2b8;
                  }
                  goto LAB_0019ea0f;
                }
                goto LAB_0019e9f8;
              }
              if (uVar31 != 0) {
                lVar24 = lVar14 * lVar30 + local_160;
                piVar1 = (int *)(lVar24 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar25 = lVar18 * lVar30 + local_1d8._24_8_;
                if (*(char *)(uVar23 + lVar25) == '\0') goto LAB_0019dfd3;
                piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -2 + uVar29) != '\0') {
                  piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar25 + -1 + uVar29) == '\0') {
LAB_0019e5b2:
                    piVar1 = (int *)(lVar24 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar25 + -2 + uVar29) == '\0') goto LAB_0019e7ad;
                    lVar21 = local_160 + lVar14 * lVar20;
                    piVar1 = (int *)(lVar21 + -4 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = local_1d8._24_8_ + lVar18 * lVar20;
                    if (*(char *)((uVar29 - 1) + lVar14) == '\0') goto LAB_0019e5ff;
                    piVar1 = (int *)(lVar24 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar25 + uVar29) == '\0') {
                      piVar1 = (int *)(lVar21 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      bVar32 = *(char *)(lVar14 + uVar29) == '\0';
                      goto LAB_0019d8a1;
                    }
                    goto LAB_0019e9f8;
                  }
                  piVar1 = (int *)(lVar24 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar25 + uVar29) != '\0') goto LAB_0019e9f8;
                  piVar1 = (int *)(local_160 + lVar14 * lVar20 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
LAB_0019db9b:
                  cVar4 = *(char *)(uVar29 + local_1d8._24_8_ + lVar18 * lVar20);
LAB_0019e276:
                  lVar14 = *local_290;
                  goto joined_r0x0019e289;
                }
                piVar1 = (int *)(lVar24 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if ((*(char *)(lVar25 + uVar29) != '\0') ||
                   (piVar1 = (int *)(lVar24 + -4 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar25 + -1 + uVar29) == '\0')) goto LAB_0019e7ad;
                piVar1 = (int *)(local_160 + lVar14 * lVar20 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar21 = *local_290;
                lVar14 = lVar21 * lVar20 + local_2c8;
                if (*(char *)(uVar29 + local_1d8._24_8_ + lVar18 * lVar20) == '\0') {
                  piVar1 = (int *)(lVar14 + -8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                  uVar13 = *(uint *)(lVar18 + -8 + uVar29 * 4);
                  piVar1 = (int *)(lVar14 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar18 + uVar29 * 4);
LAB_0019ecc1:
                  uVar13 = TTA::MemMerge(uVar13,uVar16);
                  piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + -8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(*(long *)local_340._80_8_ * uVar31 + local_340._24_8_ + -8 +
                                    uVar29 * 4);
                  goto LAB_0019ec45;
                }
                piVar1 = (int *)(lVar14 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = *(long *)local_340._80_8_;
                uVar13 = *(uint *)(lVar14 * lVar20 + local_340._24_8_ + uVar29 * 4);
LAB_0019e8d4:
                piVar1 = (int *)(local_2c8 + lVar21 * uVar31 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = lVar14 * uVar31 + local_340._24_8_;
                goto LAB_0019ec40;
              }
LAB_0019dfd3:
              piVar1 = (int *)(lVar22 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + uVar23) == '\0') goto LAB_0019e07a;
              uVar28 = local_270;
              if (lVar27 <= (long)(uVar29 + 2)) {
                if (uVar31 == 0) goto LAB_0019e693;
LAB_0019e370:
                lVar27 = lVar14 * lVar30 + local_160;
                piVar1 = (int *)(lVar27 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar24 = lVar18 * lVar30 + local_1d8._24_8_;
                if (*(char *)((uVar29 - 1) + lVar24) != '\0') {
                  piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar4 = *(char *)(lVar21 + -2 + uVar29);
                  lVar14 = *local_290;
                  lVar27 = local_278;
                  goto joined_r0x0019e0c6;
                }
                piVar1 = (int *)(lVar27 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar24 + uVar29) == '\0') goto LAB_0019e693;
                piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if ((*(char *)(lVar21 + -2 + uVar29) == '\0') ||
                   (piVar1 = (int *)(lVar27 + -8 + uVar29 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar24 + -2 + uVar29) == '\0')) {
                  lVar27 = *local_290;
                  piVar1 = (int *)(lVar27 * lVar20 + local_2c8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = *(long *)local_340._80_8_;
                  uVar13 = *(uint *)(lVar14 * lVar20 + local_340._24_8_ + uVar29 * 4);
                  piVar1 = (int *)(lVar27 * uVar31 + local_2c8 + -8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar14 * uVar31 + local_340._24_8_ + -8 +
                                                         uVar29 * 4));
                  piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
                  lVar27 = local_278;
                  uVar28 = local_270;
                  goto LAB_0019ea2e;
                }
                piVar1 = (int *)(local_160 + lVar14 * lVar20 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                cVar4 = *(char *)((uVar29 - 1) + local_1d8._24_8_ + lVar18 * lVar20);
                lVar14 = *local_290;
                lVar27 = local_278;
joined_r0x0019e289:
                if (cVar4 == '\0') goto LAB_0019e292;
                goto LAB_0019ea0f;
              }
              if (uVar31 != 0) {
                lVar24 = local_160 + lVar14 * lVar30;
                piVar1 = (int *)(lVar24 + 8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar25 = local_1d8._24_8_ + lVar18 * lVar30;
                if (*(char *)(uVar29 + 2 + lVar25) == '\0') goto LAB_0019e370;
                piVar1 = (int *)(lVar22 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -2 + uVar29) == '\0') {
                  piVar1 = (int *)(lVar24 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar25 + uVar29) == '\0') {
                    piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_278;
                    if (*(char *)(lVar25 + -1 + uVar29) == '\0') goto LAB_0019ebeb;
                    lVar14 = local_160 + lVar14 * lVar20;
                    piVar1 = (int *)(lVar14 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_1d8._24_8_ + lVar18 * lVar20;
                    if (*(char *)(uVar23 + lVar27) == '\0') {
                      lVar27 = *local_290 * lVar20 + local_2c8;
                      piVar1 = (int *)(lVar27 + -8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                      uVar13 = *(uint *)(lVar14 + -8 + uVar29 * 4);
                      goto LAB_0019ecb7;
                    }
                    piVar1 = (int *)(lVar14 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar21 = *local_290;
                    lVar14 = lVar21 * lVar20 + local_2c8;
                    if (*(char *)(lVar27 + uVar29) != '\0') goto LAB_0019e8b3;
                    piVar1 = (int *)(lVar14 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                    uVar13 = *(uint *)(lVar27 + -8 + uVar29 * 4);
                  }
                  else {
                    piVar1 = (int *)(local_160 + lVar14 * lVar20 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar21 = *local_290;
                    cVar4 = *(char *)(uVar23 + local_1d8._24_8_ + lVar18 * lVar20);
joined_r0x0019e8ad:
                    lVar14 = lVar21 * lVar20 + local_2c8;
                    if (cVar4 != '\0') {
LAB_0019e8b3:
                      piVar1 = (int *)(lVar14 + 8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = *(long *)local_340._80_8_;
                      uVar13 = *(uint *)(lVar14 * lVar20 + local_340._24_8_ + 8 + uVar29 * 4);
                      lVar27 = local_278;
                      goto LAB_0019e8d4;
                    }
                    piVar1 = (int *)(lVar14 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = *(long *)local_340._80_8_ * lVar20 + local_340._24_8_;
                    uVar13 = *(uint *)(lVar27 + uVar29 * 4);
                  }
                  piVar1 = (int *)(lVar14 + 8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar27 + 8 + uVar29 * 4);
                  lVar27 = local_278;
                  goto LAB_0019ecc1;
                }
                piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                cVar4 = *(char *)(lVar25 + -1 + uVar29);
                lVar17 = local_160 + lVar14 * lVar20;
                piVar1 = (int *)(lVar17 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = local_1d8._24_8_ + lVar18 * lVar20;
                cVar3 = *(char *)(uVar23 + lVar14);
                if (cVar4 == '\0') {
                  if (cVar3 == '\0') {
                    piVar1 = (int *)(lVar24 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_278;
                    if (*(char *)(lVar25 + uVar29) != '\0') goto LAB_0019eb57;
                  }
                  else {
LAB_0019e9c7:
                    piVar1 = (int *)(lVar24 + -8 + uVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_278;
                    if (*(char *)(lVar25 + -2 + uVar29) != '\0') {
                      piVar1 = (int *)(lVar17 + -4 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar3 = *(char *)(lVar14 + -1 + uVar29);
                      goto joined_r0x0019e9e3;
                    }
                  }
                }
                else {
joined_r0x0019e9e3:
                  lVar27 = local_278;
                  if (cVar3 != '\0') goto LAB_0019e9e9;
                }
                goto LAB_0019ebeb;
              }
LAB_0019e693:
              lVar27 = *local_290 * uVar31 + local_2c8;
              piVar1 = (int *)(lVar27 + -8 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
              uVar13 = *(uint *)(lVar14 + -8 + uVar29 * 4);
              piVar1 = (int *)(lVar27 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar27 = local_278;
            }
            else {
              uVar23 = uVar29 | 1;
              if (lVar27 <= (long)uVar23) goto LAB_0019e9f8;
              if (uVar31 == 0) {
LAB_0019de1d:
                piVar1 = (int *)(lVar22 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                if (((*(char *)(lVar21 + uVar23) != '\0') && (uVar31 != 0)) &&
                   ((long)(uVar29 + 2) < lVar27)) {
                  lVar21 = lVar14 * lVar30 + local_160;
                  piVar1 = (int *)(lVar21 + 8 + uVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar22 = lVar18 * lVar30 + local_1d8._24_8_;
                  if (*(char *)(uVar29 + 2 + lVar22) != '\0') {
                    lVar24 = local_160 + lVar14 * lVar20;
                    piVar1 = (int *)(lVar24 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = local_1d8._24_8_ + lVar18 * lVar20;
                    if (*(char *)(uVar23 + lVar14) == '\0') {
LAB_0019e48d:
                      lVar18 = *local_290;
                      piVar1 = (int *)(lVar18 * lVar20 + local_2c8 + 8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = *(long *)local_340._80_8_;
                    }
                    else {
                      piVar1 = (int *)(lVar21 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar22 + uVar29) != '\0') goto LAB_0019e9f8;
                      piVar1 = (int *)(lVar24 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar14 + uVar29) != '\0') {
                        piVar1 = (int *)(lVar21 + -4 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar22 + -1 + uVar29) != '\0') goto LAB_0019e9f8;
                        piVar1 = (int *)(lVar21 + -8 + uVar29 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar22 + -2 + uVar29) != '\0') {
                          piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                          *piVar1 = *piVar1 + 1;
                          bVar32 = *(char *)(lVar14 + -1 + uVar29) == '\0';
                          goto LAB_0019eaf3;
                        }
                      }
LAB_0019ebeb:
                      lVar18 = *local_290;
                      piVar1 = (int *)(lVar18 * lVar20 + local_2c8 + 8 + uVar29 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = *(long *)local_340._80_8_;
                    }
                    uVar13 = *(uint *)(lVar14 * lVar20 + local_340._24_8_ + 8 + uVar29 * 4);
                    goto LAB_0019ec2d;
                  }
                }
LAB_0019e9f8:
                lVar14 = *local_290;
LAB_0019ea0f:
                lVar18 = local_2c8 + lVar14 * uVar31;
                piVar1 = (int *)(lVar18 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
                uVar13 = *(uint *)(lVar14 + -8 + uVar29 * 4);
                piVar1 = (int *)(lVar18 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_0019ea2e;
              }
              lVar24 = lVar14 * lVar30 + local_160;
              piVar1 = (int *)(lVar24 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar25 = lVar18 * lVar30 + local_1d8._24_8_;
              if (*(char *)(uVar23 + lVar25) == '\0') goto LAB_0019de1d;
              piVar1 = (int *)(lVar24 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar25 + uVar29) != '\0') goto LAB_0019e9f8;
              lVar21 = local_160 + lVar14 * lVar20;
              piVar1 = (int *)(lVar21 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = local_1d8._24_8_ + lVar18 * lVar20;
              if (*(char *)(uVar29 + lVar14) != '\0') {
                piVar1 = (int *)(lVar24 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar25 + -1 + uVar29) != '\0') goto LAB_0019e9f8;
                piVar1 = (int *)(lVar24 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar25 + -2 + uVar29) == '\0') goto LAB_0019e7ad;
                piVar1 = (int *)(lVar21 + -4 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                bVar32 = *(char *)(lVar14 + -1 + uVar29) == '\0';
LAB_0019d8a1:
                lVar14 = *local_290;
                if (!bVar32) goto LAB_0019ea0f;
LAB_0019e292:
                piVar1 = (int *)(lVar14 * lVar20 + local_2c8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_340._80_8_;
                uVar13 = *(uint *)(lVar18 * lVar20 + local_340._24_8_ + uVar29 * 4);
LAB_0019e2b8:
                piVar1 = (int *)(lVar14 * uVar31 + local_2c8 + -8 + uVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = lVar18 * uVar31 + local_340._24_8_;
                goto LAB_0019ec40;
              }
LAB_0019e5ff:
              lVar18 = *local_290;
LAB_0019e7c7:
              piVar1 = (int *)(lVar18 * lVar20 + local_2c8 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_340._80_8_;
LAB_0019e7e6:
              uVar13 = *(uint *)(lVar14 * lVar20 + local_340._24_8_ + uVar29 * 4);
LAB_0019ec2d:
              piVar1 = (int *)(lVar18 * uVar31 + local_2c8 + -8 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = lVar14 * uVar31 + local_340._24_8_;
LAB_0019ec40:
              uVar16 = *(uint *)(lVar14 + -8 + uVar29 * 4);
LAB_0019ec45:
              uVar13 = TTA::MemMerge(uVar13,uVar16);
LAB_0019e581:
              piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + uVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
            }
          }
LAB_0019ea2e:
          *(uint *)(lVar14 + uVar29 * 4) = uVar13;
          uVar29 = uVar29 + 2;
        } while ((long)uVar29 < lVar27);
      }
      uVar31 = uVar31 + 2;
    } while (uVar31 < uVar28);
    uVar13 = TTA::MemFlatten();
    (local_250->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
    if (0 < (int)uVar28) {
      local_200 = local_2c8;
      local_208 = local_290;
      local_210 = local_340._24_8_;
      local_218 = (long *)local_340._80_8_;
      lVar30 = 1;
      local_268 = 0;
      do {
        piVar10 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar9 = TTA::mem_rtable_.vec_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < (int)lVar27) {
          local_258 = (long *)local_340._80_8_;
          local_260 = local_268 | 1;
          local_1f0 = TTA::mem_rtable_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_1f8 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_228 = local_128;
          local_230 = (long *)local_1d8._80_8_;
          local_1e0 = *local_290 * local_268 + local_2c8;
          local_1e8 = *(long *)local_340._80_8_ * local_268 + local_340._24_8_;
          local_240 = local_160;
          local_248 = local_1d8._24_8_;
          lVar20 = 1;
          do {
            piVar1 = (int *)(local_1e0 + -4 + lVar20 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = (long)*(int *)(local_1e8 + -4 + lVar20 * 4);
            if (lVar14 < 1) {
              lVar14 = *local_290;
              lVar21 = local_268 * lVar14 + local_2c8;
              piVar1 = (int *)(lVar21 + -4 + lVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)local_340._80_8_;
              lVar22 = local_268 * lVar18 + local_340._24_8_;
              *(undefined4 *)(lVar22 + -4 + lVar20 * 4) = 0;
              if (lVar20 < lVar27) {
                piVar1 = (int *)(lVar21 + lVar20 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar22 + lVar20 * 4) = 0;
                if (local_260 < uVar28) {
                  lVar27 = lVar14 * lVar30 + local_2c8;
                  piVar1 = (int *)(lVar27 + -4 + lVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = lVar18 * lVar30 + local_340._24_8_;
                  *(undefined4 *)(lVar14 + -4 + lVar20 * 4) = 0;
                  piVar1 = (int *)(lVar27 + lVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar14 + lVar20 * 4) = 0;
                }
              }
              else if (local_260 < uVar28) {
                piVar1 = (int *)(lVar14 * lVar30 + local_2c8 + -4 + lVar20 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar18 * lVar30 + local_340._24_8_ + -4 + lVar20 * 4) = 0;
              }
            }
            else {
              piVar10[lVar14] = piVar10[lVar14] + 1;
              uVar13 = puVar9[lVar14];
              lVar14 = *local_128;
              lVar24 = local_268 * lVar14 + local_160;
              piVar1 = (int *)(lVar24 + -4 + lVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)local_1d8._80_8_;
              lVar22 = local_268 * lVar18 + local_1d8._24_8_;
              lVar21 = *local_290;
              lVar25 = local_268 * lVar21 + local_2c8;
              uVar16 = uVar13;
              if (*(char *)(lVar20 + -1 + lVar22) == '\0') {
                uVar16 = 0;
              }
              piVar1 = (int *)(lVar25 + -4 + lVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar17 = *(long *)local_340._80_8_;
              lVar26 = local_268 * lVar17 + local_340._24_8_;
              *(uint *)(lVar26 + -4 + lVar20 * 4) = uVar16;
              uVar28 = local_270;
              if (lVar20 < lVar27) {
                piVar1 = (int *)(lVar24 + lVar20 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = uVar13;
                if (*(char *)(lVar20 + lVar22) == '\0') {
                  uVar16 = 0;
                }
                piVar1 = (int *)(lVar25 + lVar20 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar26 + lVar20 * 4) = uVar16;
                if (local_260 < local_270) {
                  piVar1 = (int *)(lVar14 * lVar30 + local_160 + -4 + lVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = uVar13;
                  if (*(char *)(lVar20 + -1 + lVar18 * lVar30 + local_1d8._24_8_) == '\0') {
                    lVar21 = *local_290;
                    uVar16 = 0;
                  }
                  piVar1 = (int *)(lVar21 * lVar30 + local_2c8 + -4 + lVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_340._80_8_ * lVar30 + local_340._24_8_ + -4 + lVar20 * 4)
                       = uVar16;
                  piVar1 = (int *)(*local_128 * lVar30 + local_160 + lVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar20 + *(long *)local_1d8._80_8_ * lVar30 + local_1d8._24_8_) ==
                      '\0') {
                    piVar1 = (int *)(*local_290 * lVar30 + local_2c8 + lVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)
                     (*(long *)local_340._80_8_ * lVar30 + local_340._24_8_ + lVar20 * 4) = 0;
                  }
                  else {
                    piVar1 = (int *)(*local_290 * lVar30 + local_2c8 + lVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(*(long *)local_340._80_8_ * lVar30 + local_340._24_8_ + lVar20 * 4) =
                         uVar13;
                  }
                }
              }
              else if (local_260 < local_270) {
                piVar1 = (int *)(lVar14 * lVar30 + local_160 + -4 + lVar20 * 4);
                *piVar1 = *piVar1 + 1;
                cVar4 = *(char *)(lVar20 + -1 + lVar18 * lVar30 + local_1d8._24_8_);
                piVar1 = (int *)(lVar21 * lVar30 + local_2c8 + -4 + lVar20 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = lVar17 * lVar30 + local_340._24_8_;
                if (cVar4 == '\0') {
                  *(undefined4 *)(lVar27 + -4 + lVar20 * 4) = 0;
                }
                else {
                  *(uint *)(lVar27 + -4 + lVar20 * 4) = uVar13;
                }
              }
            }
            lVar14 = lVar20 + 1;
            lVar20 = lVar20 + 2;
            lVar27 = local_278;
            local_238 = lVar30;
          } while (lVar14 < local_278);
        }
        local_268 = local_268 + 2;
        lVar30 = lVar30 + 2;
      } while (local_268 < uVar28);
    }
  }
  pauVar15 = (undefined1 (*) [16])operator_new(0x20);
  pvVar12 = local_220;
  pBVar11 = local_250;
  pauVar15[1] = (undefined1  [16])0x0;
  *pauVar15 = (undefined1  [16])0x0;
  puVar7 = (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar15;
  (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar15 + 2);
  (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar15 + 2);
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)puVar8 - (long)puVar7);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_170;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_2d8;
  cv::sum((_InputArray *)&local_f0);
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_f0._0_8_ >> 0x3f & (long)((double)local_f0._0_8_ - 9.223372036854776e+18)
       | (long)(double)local_f0._0_8_;
  dVar33 = TTA::MemTotalAccesses();
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar33 >> 0x3f & (long)(dVar33 - 9.223372036854776e+18) | (long)dVar33;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_340);
  cv::Mat::operator=(&((pBVar11->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,&local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_2d8);
  cv::Mat::~Mat((Mat *)(local_340 + 8));
  cv::Mat::~Mat(local_170);
  cv::Mat::~Mat((Mat *)(local_1d8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img(r-2, c-1)>0
#define CONDITION_C r-2>=0 && img(r-2, c)>0
#define CONDITION_D c+1<w && r-2>=0 && img(r-2, c+1)>0
#define CONDITION_E c+2<w && r-2>=0 && img(r-2, c+2)>0

#define CONDITION_G c-2>=0 && r-1>=0 && img(r-1, c-2)>0
#define CONDITION_H c-1>=0 && r-1>=0 && img(r-1, c-1)>0
#define CONDITION_I r-1>=0 && img(r-1, c)>0
#define CONDITION_J c+1<w && r-1>=0 && img(r-1, c+1)>0
#define CONDITION_K c+2<w && r-1>=0 && img(r-1, c+2)>0

#define CONDITION_M c-2>=0 && img(r, c-2)>0
#define CONDITION_N c-1>=0 && img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P c+1<w && img(r,c+1)>0

#define CONDITION_R c-1>=0 && r+1<h && img(r+1, c-1)>0
#define CONDITION_S r+1<h && img(r+1, c)>0
#define CONDITION_T c+1<w && r+1<h && img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2); continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c); continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2); continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2)); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2)); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2)); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2)); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }